

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::getTagPair<toml::basic_value<toml::type_config>>
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,helics *this,basic_value<toml::type_config> *tagValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  value_type *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *extraout_RAX;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  value *element;
  string val;
  string name;
  key_type local_78;
  string local_58;
  undefined1 local_38 [32];
  
  fileops::getName_abi_cxx11_((string *)local_38,(fileops *)this,tagValue);
  if (local_38._8_8_ == 0) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
         CONCAT17(local_58._M_dataplus._M_p._7_1_,local_58._M_dataplus._M_p._0_7_);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
         CONCAT71((undefined7)local_58._M_string_length,local_58._M_dataplus._M_p._7_1_);
    (__return_storage_ptr__->first)._M_string_length = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 1) =
         CONCAT17(local_78._M_dataplus._M_p._7_1_,local_78._M_dataplus._M_p._0_7_);
    *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
         CONCAT71((undefined7)local_78._M_string_length,local_78._M_dataplus._M_p._7_1_);
    (__return_storage_ptr__->second)._M_string_length = 0;
  }
  else {
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p._0_7_ = SUB87(paVar1,0);
    local_78._M_dataplus._M_p._7_1_ = (undefined1)((ulong)paVar1 >> 0x38);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"value","");
    bVar2 = toml::basic_value<toml::type_config>::contains
                      ((basic_value<toml::type_config> *)this,&local_78);
    if (bVar2) {
      this_00 = toml::basic_value<toml::type_config>::at
                          ((basic_value<toml::type_config> *)this,&local_78);
      fileops::tomlAsString_abi_cxx11_(&local_58,(fileops *)this_00,element);
    }
    else {
      local_58._M_dataplus._M_p._0_7_ = SUB87(&local_58.field_2,0);
      local_58._M_dataplus._M_p._7_1_ = (undefined1)((ulong)&local_58.field_2 >> 0x38);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT17(local_78._M_dataplus._M_p._7_1_,local_78._M_dataplus._M_p._0_7_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT17(local_78._M_dataplus._M_p._7_1_,local_78._M_dataplus._M_p._0_7_),
                      local_78.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               &local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT17(local_58._M_dataplus._M_p._7_1_,local_58._M_dataplus._M_p._0_7_) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT17(local_58._M_dataplus._M_p._7_1_,local_58._M_dataplus._M_p._0_7_),
                      local_58.field_2._M_allocated_capacity + 1);
    }
  }
  ppVar3 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(local_38 + 0x10);
  if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_38._0_8_ != ppVar3) {
    operator_delete((void *)local_38._0_8_,local_38._16_8_ + 1);
    ppVar3 = extraout_RAX;
  }
  return ppVar3;
}

Assistant:

static std::pair<std::string, std::string> getTagPair(const TV& tagValue)
{
    const std::string name = fileops::getName(tagValue);
    if (name.empty()) {
    } else {
        const std::string val =
            fileops::getOrDefault(tagValue, std::string("value"), std::string_view{});
        return std::make_pair(name, val);
    }

    return std::make_pair(std::string{}, std::string{});
}